

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ushort uVar7;
  uint *__s;
  uint uVar8;
  uint *__s_00;
  bool bVar9;
  size_t sVar6;
  
  uVar1 = *(ushort *)&this->field_0x8;
  uVar2 = *(ushort *)&other->field_0x8;
  uVar7 = uVar2 & 0xff;
  bVar9 = (uVar1 & 0xff) < uVar7;
  if ((uVar1 & 0xff) == uVar7) {
    switch((char)uVar1) {
    case '\0':
      bVar9 = false;
      break;
    case '\x01':
      bVar9 = (this->value_).int_ < (other->value_).int_;
      break;
    case '\x02':
      bVar9 = (this->value_).uint_ < (other->value_).uint_;
      break;
    case '\x03':
      bVar9 = (this->value_).real_ <= (other->value_).real_ &&
              (other->value_).real_ != (this->value_).real_;
      break;
    case '\x04':
      __s = (uint *)(this->value_).string_;
      __s_00 = (uint *)(other->value_).string_;
      if (__s_00 == (uint *)0x0 || __s == (uint *)0x0) {
        bVar9 = __s_00 != (uint *)0x0;
      }
      else {
        if ((uVar1 >> 8 & 1) == 0) {
          sVar6 = strlen((char *)__s);
          uVar5 = (uint)sVar6;
        }
        else {
          uVar5 = *__s;
          __s = __s + 1;
        }
        if ((uVar2 >> 8 & 1) == 0) {
          sVar6 = strlen((char *)__s_00);
          uVar8 = (uint)sVar6;
        }
        else {
          uVar8 = *__s_00;
          __s_00 = __s_00 + 1;
        }
        uVar3 = uVar5;
        if (uVar8 < uVar5) {
          uVar3 = uVar8;
        }
        iVar4 = memcmp(__s,__s_00,(ulong)uVar3);
        bVar9 = true;
        if (-1 < iVar4) {
          bVar9 = uVar5 < uVar8 && iVar4 == 0;
        }
      }
      break;
    case '\x05':
      bVar9 = (this->value_).bool_ < (other->value_).bool_;
      break;
    case '\x06':
    case '\a':
      iVar4 = (int)(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count -
              (int)(((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      if (iVar4 == 0) {
        bVar9 = std::operator<(&((this->value_).map_)->_M_t,&((other->value_).map_)->_M_t);
        return bVar9;
      }
      bVar9 = SUB41((uint)iVar4 >> 0x1f,0);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Expost[P]SimpleFtpServer/jsoncpp.cpp"
                    ,0xbaf,"bool Json::Value::operator<(const Value &) const");
    }
  }
  return bVar9;
}

Assistant:

bool Value::operator<(const Value& other) const {
  int typeDelta = type_ - other.type_;
  if (typeDelta)
    return typeDelta < 0 ? true : false;
  switch (type_) {
  case nullValue:
    return false;
  case intValue:
    return value_.int_ < other.value_.int_;
  case uintValue:
    return value_.uint_ < other.value_.uint_;
  case realValue:
    return value_.real_ < other.value_.real_;
  case booleanValue:
    return value_.bool_ < other.value_.bool_;
  case stringValue:
  {
    if ((value_.string_ == 0) || (other.value_.string_ == 0)) {
      if (other.value_.string_) return true;
      else return false;
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    decodePrefixedString(other.allocated_, other.value_.string_, &other_len, &other_str);
    unsigned min_len = std::min(this_len, other_len);
    JSON_ASSERT(this_str && other_str);
    int comp = memcmp(this_str, other_str, min_len);
    if (comp < 0) return true;
    if (comp > 0) return false;
    return (this_len < other_len);
  }
  case arrayValue:
  case objectValue: {
    int delta = int(value_.map_->size() - other.value_.map_->size());
    if (delta)
      return delta < 0;
    return (*value_.map_) < (*other.value_.map_);
  }
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}